

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

bool __thiscall
ON_Mesh::IsValidNewNgonInformation
          (ON_Mesh *this,uint Vcount,uint *ngon_vi,uint Fcount,uint *ngon_fi)

{
  uint uVar1;
  uint uVar2;
  uint *local_60;
  uint *ngon_map;
  uint meshFcount;
  uint meshVcount;
  uint i;
  uint *ngon_fi_local;
  uint Fcount_local;
  uint *ngon_vi_local;
  uint Vcount_local;
  ON_Mesh *this_local;
  
  uVar1 = ON_SimpleArray<ON_3fPoint>::UnsignedCount(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
  uVar2 = ON_SimpleArray<ON_MeshFace>::UnsignedCount(&this->m_F);
  if (Vcount < 3) {
    this_local._7_1_ = false;
  }
  else {
    for (meshFcount = 0; meshFcount < Vcount; meshFcount = meshFcount + 1) {
      if (uVar1 <= ngon_vi[meshFcount]) {
        return false;
      }
    }
    if (Fcount == 0) {
      local_60 = (uint *)0x0;
    }
    else {
      local_60 = NgonMap(this);
    }
    for (meshFcount = 0; meshFcount < Fcount; meshFcount = meshFcount + 1) {
      if (uVar2 <= ngon_fi[meshFcount]) {
        return false;
      }
      if ((local_60 != (uint *)0x0) && (local_60[ngon_fi[meshFcount]] != 0xffffffff)) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Mesh::IsValidNewNgonInformation(
  unsigned int Vcount, 
  const unsigned int* ngon_vi,
  unsigned int Fcount, 
  const unsigned int* ngon_fi
  ) const
{
  unsigned int i;
  const unsigned int meshVcount = m_V.UnsignedCount();
  const unsigned int meshFcount = m_F.UnsignedCount();
  if ( Vcount < 3 )
    return false;

  for ( i = 0; i < Vcount; i++ )
  {
    if ( ngon_vi[i] >= meshVcount )
      return false;
  }

  const unsigned int* ngon_map = (Fcount > 0) ? NgonMap() : 0;

  for ( i = 0; i < Fcount; i++ )
  {
    if ( ngon_fi[i] >= meshFcount )
      return false;
    if ( ngon_map && ON_UNSET_UINT_INDEX != ngon_map[ngon_fi[i]] )
      return false;
  }

  return true;
}